

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

future<int> __thiscall prometheus::Gateway::async_push(Gateway *this,HttpMethod method)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  CollectableEntry *collectable_00;
  future<int> fVar3;
  undefined1 local_149 [8];
  type reduceFutures;
  string local_140 [32];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  CollectableEntry *local_110;
  value_type local_108;
  undefined1 local_f8 [8];
  string uri;
  Serializer local_d8 [4];
  undefined1 local_b8 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> body;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  undefined1 local_88 [8];
  shared_ptr<prometheus::Collectable> collectable;
  pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *wcollectable;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  TextSerializer serializer;
  HttpMethod method_local;
  Gateway *this_local;
  
  collectable_00 = (CollectableEntry *)CONCAT44(in_register_00000034,method);
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TextSerializer::TextSerializer
            ((TextSerializer *)
             &futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::vector
            ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)&lock);
  ::std::lock_guard<std::mutex>::lock_guard(&local_48,(mutex_type *)&collectable_00[1].field_0x18);
  __end1 = ::std::
           vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&collectable_00[2].second);
  wcollectable = (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)::std::
                    vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&collectable_00[2].second);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&wcollectable), bVar1) {
    collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end1);
    ::std::weak_ptr<prometheus::Collectable>::lock((weak_ptr<prometheus::Collectable> *)local_88);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_88);
    if (bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
      (*peVar2->_vptr_Collectable[2])
                (&body.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Serializer::Serialize_abi_cxx11_
                (local_d8,(vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                           *)&futures.
                              super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::make_shared<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      ::std::__cxx11::string::~string((string *)local_d8);
      getUri((Gateway *)local_f8,collectable_00);
      ::std::__cxx11::string::string(local_140,(string *)local_f8);
      ::std::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      shared_ptr(&local_120,
                 (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8);
      local_110 = collectable_00;
      ::std::async<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__0>
                ((launch)&local_108,(type *)0x1);
      ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::push_back
                ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)&lock,&local_108);
      ::std::future<int>::~future(&local_108);
      async_push(prometheus::detail::HttpMethod)::$_0::~__0((__0 *)(local_149 + 1));
      ::std::__cxx11::string::~string((string *)local_f8);
      ::std::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
      ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 &body.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    ::std::shared_ptr<prometheus::Collectable>::~shared_ptr
              ((shared_ptr<prometheus::Collectable> *)local_88);
    __gnu_cxx::
    __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  ::std::
  async<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__1_const&,std::vector<std::future<int>,std::allocator<std::future<int>>>>
            ((launch)this,(type *)0x1,
             (vector<std::future<int>,_std::allocator<std::future<int>_>_> *)local_149);
  ::std::lock_guard<std::mutex>::~lock_guard(&local_48);
  ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector
            ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)&lock);
  TextSerializer::~TextSerializer
            ((TextSerializer *)
             &futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  fVar3.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar3.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<int>)
         fVar3.super___basic_future<int>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<int> Gateway::async_push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};
  std::vector<std::future<int>> futures;

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = std::make_shared<std::string>(serializer.Serialize(metrics));
    auto uri = getUri(wcollectable);

    futures.push_back(std::async(std::launch::async, [method, uri, body, this] {
      return curlWrapper_->performHttpRequest(method, uri, *body);
    }));
  }

  const auto reduceFutures = [](std::vector<std::future<int>> lfutures) {
    auto final_status_code = 200;

    for (auto& future : lfutures) {
      auto status_code = future.get();

      if (status_code < 100 || status_code >= 400) {
        final_status_code = status_code;
      }
    }

    return final_status_code;
  };

  return std::async(std::launch::async, reduceFutures, std::move(futures));
}